

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

int magic_negation(monst *mon)

{
  xchar xVar1;
  obj *local_98;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  obj *local_78;
  obj *local_70;
  obj *local_68;
  obj *local_60;
  obj *local_58;
  obj *local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  obj *local_30;
  int bonus;
  xchar sklev;
  int armpro;
  obj *armor;
  monst *mon_local;
  
  bonus = 0;
  if (mon == &youmonst) {
    local_30 = uarm;
  }
  else {
    local_30 = which_armor(mon,1);
  }
  if ((local_30 != (obj *)0x0) && ('\0' < objects[local_30->otyp].oc_oc2)) {
    bonus = (int)objects[local_30->otyp].oc_oc2;
  }
  if ((local_30 != (obj *)0x0) && (199 < local_30->owt)) {
    local_40 = local_30->owt / 100 - 1;
    xVar1 = mon_skill_level(0x28,mon);
    if (xVar1 < '\x04') {
      if (xVar1 == '\x03') {
        local_3c = 2;
      }
      else {
        local_3c = (uint)(xVar1 == '\x02');
      }
      local_38 = local_3c;
    }
    else {
      local_38 = 3;
    }
    if ((int)local_38 <= (int)local_40) {
      if (xVar1 < '\x04') {
        if (xVar1 == '\x03') {
          local_48 = 2;
        }
        else {
          local_48 = (uint)(xVar1 == '\x02');
        }
        local_44 = local_48;
      }
      else {
        local_44 = 3;
      }
      local_40 = local_44;
    }
    if (bonus < (int)local_40) {
      bonus = local_40;
    }
  }
  if (mon == &youmonst) {
    local_50 = uarmc;
  }
  else {
    local_50 = which_armor(mon,2);
  }
  if ((local_50 != (obj *)0x0) && (bonus < objects[local_50->otyp].oc_oc2)) {
    bonus = (int)objects[local_50->otyp].oc_oc2;
  }
  if (mon == &youmonst) {
    local_58 = uarmh;
  }
  else {
    local_58 = which_armor(mon,4);
  }
  if ((local_58 != (obj *)0x0) && (bonus < objects[local_58->otyp].oc_oc2)) {
    bonus = (int)objects[local_58->otyp].oc_oc2;
  }
  if (mon == &youmonst) {
    local_60 = uarmu;
  }
  else {
    local_60 = which_armor(mon,0x40);
  }
  if ((local_60 != (obj *)0x0) && (bonus < objects[local_60->otyp].oc_oc2)) {
    bonus = (int)objects[local_60->otyp].oc_oc2;
  }
  if (mon == &youmonst) {
    local_68 = uarmg;
  }
  else {
    local_68 = which_armor(mon,0x10);
  }
  if ((local_68 != (obj *)0x0) && (bonus < objects[local_68->otyp].oc_oc2)) {
    bonus = (int)objects[local_68->otyp].oc_oc2;
  }
  if (mon == &youmonst) {
    local_70 = uarmf;
  }
  else {
    local_70 = which_armor(mon,0x20);
  }
  if ((local_70 != (obj *)0x0) && (bonus < objects[local_70->otyp].oc_oc2)) {
    bonus = (int)objects[local_70->otyp].oc_oc2;
  }
  if (mon == &youmonst) {
    local_78 = uarms;
  }
  else {
    local_78 = which_armor(mon,8);
  }
  if ((local_78 != (obj *)0x0) && (bonus < objects[local_78->otyp].oc_oc2)) {
    bonus = (int)objects[local_78->otyp].oc_oc2;
  }
  if (local_78 != (obj *)0x0) {
    local_88 = (int)objects[local_78->otyp].oc_oc1 + (uint)(0x32 < local_78->owt);
    xVar1 = mon_skill_level(0x29,mon);
    if (xVar1 < '\x04') {
      if (xVar1 == '\x03') {
        local_84 = 2;
      }
      else {
        local_84 = (uint)(xVar1 == '\x02');
      }
      local_80 = local_84;
    }
    else {
      local_80 = 3;
    }
    if ((int)local_80 <= (int)local_88) {
      if (xVar1 < '\x04') {
        if (xVar1 == '\x03') {
          local_90 = 2;
        }
        else {
          local_90 = (uint)(xVar1 == '\x02');
        }
        local_8c = local_90;
      }
      else {
        local_8c = 3;
      }
      local_88 = local_8c;
    }
    if (bonus < (int)local_88) {
      bonus = local_88;
    }
  }
  if (mon == &youmonst) {
    local_98 = (obj *)0x0;
  }
  else {
    local_98 = which_armor(mon,0x100000);
  }
  if ((local_98 != (obj *)0x0) && (bonus < objects[local_98->otyp].oc_oc2)) {
    bonus = (int)objects[local_98->otyp].oc_oc2;
  }
  return bonus;
}

Assistant:

int magic_negation(struct monst *mon)
{
	struct obj *armor;
	int armpro = 0;
	xchar sklev;
	int bonus;

	armor = (mon == &youmonst) ? uarm : which_armor(mon, W_ARM);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	/*
	 * Bonus magic cancellation for body armor skill,
	 * MC1/2/3 for basic/skilled/expert.
	 */
	if (armor && armor->owt >= 200) {
	    bonus = armor->owt / 100 - 1;
	    sklev = mon_skill_level(P_BODY_ARMOR, mon);
	    bonus = min(bonus,
			sklev >= P_EXPERT ? 3 :
			sklev == P_SKILLED ? 2 :
			sklev == P_BASIC ? 1 : 0);
	    if (armpro < bonus)
		armpro = bonus;
	}

	armor = (mon == &youmonst) ? uarmc : which_armor(mon, W_ARMC);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmh : which_armor(mon, W_ARMH);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	/* armor types for shirt, gloves, and shoes don't currently
	   provide any magic cancellation but we might as well be complete */
	armor = (mon == &youmonst) ? uarmu : which_armor(mon, W_ARMU);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmg : which_armor(mon, W_ARMG);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmf : which_armor(mon, W_ARMF);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	armor = (mon == &youmonst) ? uarms : which_armor(mon, W_ARMS);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	/*
	 * Bonus magic cancellation for shield skill,
	 * MC1/2/3 for basic/skilled/expert.
	 */
	if (armor) {
	    bonus = objects[armor->otyp].a_ac + (armor->owt > 50 ? 1 : 0);
	    sklev = mon_skill_level(P_SHIELD, mon);
	    bonus = min(bonus,
			sklev >= P_EXPERT ? 3 :
			sklev == P_SKILLED ? 2 :
			sklev == P_BASIC ? 1 : 0);
	    if (armpro < bonus)
		armpro = bonus;
	}

	/* this one is really a stretch... */
	armor = (mon == &youmonst) ? 0 : which_armor(mon, W_SADDLE);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	return armpro;
}